

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O3

void asmjit::x86::X86Internal_setupSaveRestoreInfo
               (uint32_t group,FuncFrame *frame,Reg *xReg,uint32_t *xInst,uint32_t *xSize)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  
  if (group == 3) {
    (xReg->super_BaseReg).super_Operand.super_Operand_._signature = 0x381;
    (xReg->super_BaseReg).super_Operand.super_Operand_._baseId = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[0] = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[1] = 0;
    uVar1 = 0x152;
  }
  else if (group == 2) {
    (xReg->super_BaseReg).super_Operand.super_Operand_._signature = 0x8000279;
    (xReg->super_BaseReg).super_Operand.super_Operand_._baseId = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[0] = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[1] = 0;
    uVar1 = 0x1be;
  }
  else {
    if (group != 1) {
      return;
    }
    (xReg->super_BaseReg).super_Operand.super_Operand_._signature = 0x10000159;
    (xReg->super_BaseReg).super_Operand.super_Operand_._baseId = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[0] = 0;
    (xReg->super_BaseReg).super_Operand.super_Operand_._data[1] = 0;
    bVar3 = (frame->_attributes >> 0x10 & 1) == 0;
    uVar2 = 0x42b;
    if (bVar3) {
      uVar2 = 0x1a5;
    }
    uVar1 = 0x448;
    if (bVar3) {
      uVar1 = 0x1c8;
    }
    if ((frame->_attributes >> 0x1e & 1) != 0) {
      uVar1 = uVar2;
    }
  }
  *xInst = uVar1;
  *xSize = (uint)*(byte *)((long)&(xReg->super_BaseReg).super_Operand.super_Operand_._signature + 3)
  ;
  return;
}

Assistant:

static ASMJIT_INLINE void X86Internal_setupSaveRestoreInfo(uint32_t group, const FuncFrame& frame, Reg& xReg, uint32_t& xInst, uint32_t& xSize) noexcept {
  switch (group) {
    case Reg::kGroupVec:
      xReg = xmm(0);
      xInst = getXmmMovInst(frame);
      xSize = xReg.size();
      break;
    case Reg::kGroupMm:
      xReg = mm(0);
      xInst = Inst::kIdMovq;
      xSize = xReg.size();
      break;
    case Reg::kGroupKReg:
      xReg = k(0);
      xInst = Inst::kIdKmovq;
      xSize = xReg.size();
      break;
  }
}